

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O0

dlist_t * dlist_search(dlist_head_t *head,void *data,_func_int_void_ptr_void_ptr *cmp)

{
  int iVar1;
  dlist_t *local_30;
  dlist_t *dlist;
  _func_int_void_ptr_void_ptr *cmp_local;
  void *data_local;
  dlist_head_t *head_local;
  
  if ((head != (dlist_head_t *)0x0) && (head->dlist != (dlist_s *)0x0)) {
    for (local_30 = head->dlist; local_30 != (dlist_t *)0x0; local_30 = local_30->next) {
      iVar1 = (*cmp)(data,local_30->data);
      if (iVar1 != 0) {
        return local_30;
      }
    }
  }
  return (dlist_t *)0x0;
}

Assistant:

dlist_t *dlist_search(dlist_head_t *head,
      void *data,
      int (*cmp)(void *data, void *data2)) {
   dlist_t *dlist;

   if (!head || !head->dlist)
      return NULL;

   dlist = head->dlist;

   while (dlist) {
      if (cmp(data, dlist->data))
         return dlist;
      dlist = dlist->next;
   }

   return NULL;
}